

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O0

void __thiscall
tcu::ThreadUtil::Object::modify
          (Object *this,SharedPtr<tcu::ThreadUtil::Event> *event,
          vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
          *deps)

{
  size_type sVar1;
  reference __x;
  int local_24;
  int readNdx;
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  *deps_local;
  SharedPtr<tcu::ThreadUtil::Event> *event_local;
  Object *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar1 = std::
            vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
            ::size(&this->m_reads);
    if ((int)sVar1 <= local_24) break;
    __x = std::
          vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
          ::operator[](&this->m_reads,(long)local_24);
    std::
    vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
    ::push_back(deps,__x);
    local_24 = local_24 + 1;
  }
  std::
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ::push_back(deps,&this->m_modify);
  de::SharedPtr<tcu::ThreadUtil::Event>::operator=(&this->m_modify,event);
  std::
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ::clear(&this->m_reads);
  return;
}

Assistant:

void Object::modify (SharedPtr<Event> event, std::vector<SharedPtr<Event> >& deps)
{
	// Make call depend on all reads
	for (int readNdx = 0; readNdx < (int)m_reads.size(); readNdx++)
	{
		deps.push_back(m_reads[readNdx]);
	}
	deps.push_back(m_modify);

	// Update last modifying call
	m_modify = event;

	// Clear read dependencies of last "version" of this object
	m_reads.clear();
}